

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Pooling_x86::forward(Pooling_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  size_t _elemsize;
  _func_int **pp_Var3;
  int *piVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  undefined1 (*pauVar8) [16];
  long lVar9;
  int i_2;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  _func_int *p_Var13;
  int iVar14;
  Pooling *this_00;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  void *pvVar19;
  void *pvVar20;
  long lVar21;
  int i;
  int iVar22;
  long lVar23;
  void *pvVar24;
  int i_1;
  int k;
  ulong uVar25;
  int j;
  int j_1;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  void *local_108;
  allocator_type local_f1;
  _func_int **local_f0;
  Mat local_e8;
  ulong local_98;
  long local_90;
  int local_84;
  ulong local_80;
  long local_78;
  long local_70;
  long local_68;
  void *local_60;
  long local_58;
  void *local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  this_00 = (Pooling *)((long)&this->_vptr_Pooling_x86 + (long)this->_vptr_Pooling_x86[-3]);
  if ((*(int *)(&this->field_0x100 + (long)this->_vptr_Pooling_x86[-3]) != 0) ||
     (bottom_blob->elempack != 4)) {
    iVar5 = Pooling::forward(this_00,bottom_blob,top_blob,opt);
    return iVar5;
  }
  uVar2 = bottom_blob->c;
  uVar16 = (ulong)uVar2;
  _elemsize = bottom_blob->elemsize;
  if (this_00->global_pooling != 0) {
    iVar5 = bottom_blob->w;
    iVar7 = bottom_blob->h;
    Mat::create(top_blob,uVar2,_elemsize,4,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar10 = iVar7 * iVar5;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86[-3]) == 0) {
      uVar11 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar11 = 0;
      }
      if ((int)uVar2 < 1) {
        uVar16 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        lVar9 = bottom_blob->cstep * uVar15 * bottom_blob->elemsize;
        pauVar8 = (undefined1 (*) [16])((long)bottom_blob->data + lVar9);
        auVar28 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar9);
        uVar25 = uVar11;
        while (iVar5 = (int)uVar25, uVar25 = (ulong)(iVar5 - 1), iVar5 != 0) {
          auVar28 = maxps(auVar28,*pauVar8);
          pauVar8 = pauVar8 + 1;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar15 * 0x10) = auVar28;
      }
      return 0;
    }
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86[-3]) != 1) {
      return 0;
    }
    fVar27 = 1.0 / (float)(int)uVar10;
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar11 = 0;
    }
    if ((int)uVar2 < 1) {
      uVar16 = 0;
    }
    for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
      pauVar8 = (undefined1 (*) [16])
                (bottom_blob->cstep * uVar15 * bottom_blob->elemsize + (long)bottom_blob->data);
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      uVar25 = uVar11;
      while (iVar5 = (int)uVar25, uVar25 = (ulong)(iVar5 - 1), iVar5 != 0) {
        auVar28 = *pauVar8;
        fVar29 = fVar29 + auVar28._0_4_;
        fVar30 = fVar30 + auVar28._4_4_;
        fVar31 = fVar31 + auVar28._8_4_;
        fVar32 = fVar32 + auVar28._12_4_;
        pauVar8 = pauVar8 + 1;
      }
      pfVar1 = (float *)((long)top_blob->data + uVar15 * 0x10);
      *pfVar1 = fVar29 * fVar27;
      pfVar1[1] = fVar30 * fVar27;
      pfVar1[2] = fVar31 * fVar27;
      pfVar1[3] = fVar32 * fVar27;
    }
    return 0;
  }
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Pooling::make_padding(this_00,bottom_blob,&local_e8,opt);
  iVar7 = local_e8.w;
  iVar5 = -100;
  if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) goto LAB_00315588;
  p_Var13 = this->_vptr_Pooling_x86[-3];
  iVar12 = (local_e8.w - *(int *)(&this->field_0xd4 + (long)p_Var13)) /
           *(int *)(&this->field_0xdc + (long)p_Var13);
  local_90 = CONCAT44(local_90._4_4_,local_e8.h);
  uVar11 = (long)(local_e8.h - *(int *)(&this->field_0xd8 + (long)p_Var13)) /
           (long)*(int *)(&this->field_0xe0 + (long)p_Var13);
  local_98 = uVar11 & 0xffffffff;
  local_f0 = (_func_int **)CONCAT44(local_f0._4_4_,iVar12 + 1);
  Mat::create(top_blob,iVar12 + 1,(int)uVar11 + 1,uVar2,_elemsize,4,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00315588;
  uVar11 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86[-3]) *
           (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86[-3]);
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar11,&local_f1);
  pp_Var3 = this->_vptr_Pooling_x86;
  p_Var13 = pp_Var3[-3];
  iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var13);
  iVar14 = 0;
  lVar9 = 0;
  for (iVar18 = 0; iVar22 = *(int *)(&this->field_0xd8 + (long)p_Var13), iVar18 < iVar22;
      iVar18 = iVar18 + 1) {
    for (lVar23 = 0; iVar22 = (int)lVar23, iVar22 < *(int *)(&this->field_0xd4 + (long)p_Var13);
        lVar23 = lVar23 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar9 + lVar23] = iVar14 + iVar22;
      p_Var13 = pp_Var3[-3];
    }
    iVar14 = iVar14 + (iVar7 - iVar5) + iVar22;
    lVar9 = (int)lVar9 + lVar23;
  }
  iVar5 = (int)uVar11;
  if (*(int *)(&this->field_0xd0 + (long)p_Var13) == 0) {
    if (iVar22 == 2 && *(int *)(&this->field_0xd4 + (long)p_Var13) == 2) {
      if ((*(int *)(&this->field_0xdc + (long)p_Var13) == 2) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var13) == 2)) {
        iVar5 = top_blob->w;
        uVar16 = 0;
        iVar7 = iVar5;
        if (iVar5 < 1) {
          iVar7 = 0;
        }
        iVar12 = top_blob->h;
        if (top_blob->h < 1) {
          iVar12 = 0;
        }
        uVar11 = (ulong)(uint)local_e8.c;
        if (local_e8.c < 1) {
          uVar11 = uVar16;
        }
        for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
          pvVar19 = (void *)(local_e8.cstep * uVar16 *
                             CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                            (long)local_e8.data);
          pvVar20 = (void *)(top_blob->cstep * uVar16 * top_blob->elemsize + (long)top_blob->data);
          pvVar24 = (void *)((long)local_e8.w *
                             CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                            (long)pvVar19);
          for (iVar14 = 0; iVar14 != iVar12; iVar14 = iVar14 + 1) {
            lVar23 = 0;
            lVar9 = (long)((local_e8.w - iVar5) * 8) * -4;
            iVar18 = iVar7;
            while (bVar26 = iVar18 != 0, iVar18 = iVar18 + -1, bVar26) {
              auVar28 = maxps(*(undefined1 (*) [16])((long)pvVar19 + lVar23 * 2 + 0x10),
                              *(undefined1 (*) [16])((long)pvVar19 + lVar23 * 2));
              auVar33 = maxps(*(undefined1 (*) [16])((long)pvVar24 + lVar23 * 2 + 0x10),
                              *(undefined1 (*) [16])((long)pvVar24 + lVar23 * 2));
              auVar28 = maxps(auVar33,auVar28);
              *(undefined1 (*) [16])((long)pvVar20 + lVar23) = auVar28;
              lVar9 = lVar9 + -0x20;
              lVar23 = lVar23 + 0x10;
            }
            pvVar19 = (void *)((long)pvVar19 - lVar9);
            pvVar24 = (void *)((long)pvVar24 - lVar9);
            pvVar20 = (void *)((long)pvVar20 + lVar23);
          }
        }
      }
      else {
LAB_003151cc:
        uVar15 = 0;
        uVar11 = uVar11 & 0xffffffff;
        if (iVar5 < 1) {
          uVar11 = uVar15;
        }
        if ((int)uVar2 < 1) {
          uVar16 = uVar15;
        }
        for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
          pvVar19 = (void *)(top_blob->cstep * uVar15 * top_blob->elemsize + (long)top_blob->data);
          for (iVar5 = 0; iVar5 <= (int)local_98; iVar5 = iVar5 + 1) {
            pp_Var3 = this->_vptr_Pooling_x86;
            for (lVar9 = 0; lVar9 <= iVar12; lVar9 = lVar9 + 1) {
              pauVar8 = (undefined1 (*) [16])
                        ((long)local_e8.data +
                        (long)(*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) * (int)lVar9 * 4) * 4
                        + (long)*(int *)(&this->field_0xe0 + (long)pp_Var3[-3]) * (long)iVar5 *
                          (long)local_e8.w *
                          CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                          local_e8.cstep * uVar15 *
                          CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
              auVar28 = *pauVar8;
              for (uVar25 = 0; uVar11 != uVar25; uVar25 = uVar25 + 1) {
                auVar28 = maxps(auVar28,pauVar8[_space_ofs.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar25]]);
              }
              *(undefined1 (*) [16])((long)pvVar19 + lVar9 * 0x10) = auVar28;
            }
            pvVar19 = (void *)((long)pvVar19 + (long)((int)local_f0 << 2) * 4);
          }
        }
      }
    }
    else {
      if (((iVar22 != 3 || *(int *)(&this->field_0xd4 + (long)p_Var13) != 3) ||
          (*(int *)(&this->field_0xdc + (long)p_Var13) != 2)) ||
         (*(int *)(&this->field_0xe0 + (long)p_Var13) != 2)) goto LAB_003151cc;
      iVar5 = top_blob->w;
      uVar16 = 0;
      iVar7 = top_blob->h;
      if (top_blob->h < 1) {
        iVar7 = 0;
      }
      uVar2 = local_e8.c;
      if (local_e8.c < 1) {
        uVar2 = 0;
      }
      lVar9 = (long)((local_e8.w - iVar5) * 8) * 4;
      for (; uVar16 != uVar2; uVar16 = uVar16 + 1) {
        pvVar24 = (void *)(local_e8.cstep * uVar16 *
                           CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                          (long)local_e8.data);
        pauVar8 = (undefined1 (*) [16])
                  (top_blob->cstep * uVar16 * top_blob->elemsize + (long)top_blob->data);
        lVar23 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
        pvVar19 = (void *)((long)pvVar24 + lVar23);
        pvVar20 = (void *)((long)pvVar24 + lVar23 * 2);
        for (iVar12 = 0; iVar12 != iVar7; iVar12 = iVar12 + 1) {
          lVar23 = 0;
          for (iVar14 = 0; iVar14 + 1 < iVar5; iVar14 = iVar14 + 2) {
            auVar34 = maxps(*(undefined1 (*) [16])((long)pvVar24 + lVar23 + 0x10),
                            *(undefined1 (*) [16])((long)pvVar24 + lVar23));
            auVar28 = *(undefined1 (*) [16])((long)pvVar24 + lVar23 + 0x20);
            auVar33 = *(undefined1 (*) [16])((long)pvVar19 + lVar23 + 0x20);
            auVar39 = *(undefined1 (*) [16])((long)pvVar19 + lVar23 + 0x30);
            auVar36 = maxps(*(undefined1 (*) [16])((long)pvVar19 + lVar23),auVar28);
            auVar34 = maxps(auVar36,auVar34);
            auVar37 = maxps(auVar34,*(undefined1 (*) [16])((long)pvVar19 + lVar23 + 0x10));
            auVar34 = *(undefined1 (*) [16])((long)pvVar20 + lVar23 + 0x20);
            auVar36 = *(undefined1 (*) [16])((long)pvVar20 + lVar23 + 0x30);
            auVar35 = maxps(*(undefined1 (*) [16])((long)pvVar20 + lVar23),auVar33);
            auVar38 = maxps(*(undefined1 (*) [16])((long)pvVar20 + lVar23 + 0x10),auVar34);
            auVar35 = maxps(auVar38,auVar35);
            auVar38 = maxps(auVar35,auVar37);
            auVar35 = maxps(*(undefined1 (*) [16])((long)pvVar24 + lVar23 + 0x40),
                            *(undefined1 (*) [16])((long)pvVar24 + lVar23 + 0x30));
            auVar37 = maxps(*(undefined1 (*) [16])((long)pvVar20 + lVar23 + 0x40),
                            *(undefined1 (*) [16])((long)pvVar19 + lVar23 + 0x40));
            *pauVar8 = auVar38;
            auVar28 = maxps(auVar39,auVar28);
            auVar28 = maxps(auVar28,auVar35);
            auVar39 = maxps(auVar36,auVar33);
            auVar33 = maxps(auVar37,auVar34);
            auVar28 = maxps(auVar33,auVar28);
            auVar28 = maxps(auVar28,auVar39);
            pauVar8[1] = auVar28;
            pauVar8 = pauVar8 + 2;
            lVar23 = lVar23 + 0x40;
          }
          for (; iVar14 < iVar5; iVar14 = iVar14 + 1) {
            auVar28 = maxps(*(undefined1 (*) [16])((long)pvVar24 + lVar23 + 0x10),
                            *(undefined1 (*) [16])((long)pvVar24 + lVar23));
            auVar33 = maxps(*(undefined1 (*) [16])((long)pvVar19 + lVar23),
                            *(undefined1 (*) [16])((long)pvVar24 + lVar23 + 0x20));
            auVar28 = maxps(auVar33,auVar28);
            auVar28 = maxps(*(undefined1 (*) [16])((long)pvVar19 + lVar23 + 0x10),auVar28);
            auVar33 = maxps(*(undefined1 (*) [16])((long)pvVar20 + lVar23),
                            *(undefined1 (*) [16])((long)pvVar19 + lVar23 + 0x20));
            auVar39 = maxps(*(undefined1 (*) [16])((long)pvVar20 + lVar23 + 0x20),
                            *(undefined1 (*) [16])((long)pvVar20 + lVar23 + 0x10));
            auVar33 = maxps(auVar39,auVar33);
            auVar28 = maxps(auVar33,auVar28);
            *pauVar8 = auVar28;
            pauVar8 = pauVar8 + 1;
            lVar23 = lVar23 + 0x20;
          }
          pvVar24 = (void *)((long)pvVar24 + lVar23 + lVar9);
          pvVar19 = (void *)((long)pvVar19 + lVar23 + lVar9);
          pvVar20 = (void *)((long)pvVar20 + lVar23 + lVar9);
        }
      }
    }
  }
  else if (*(int *)(&this->field_0xd0 + (long)p_Var13) == 1) {
    if (*(int *)(&this->field_0xfc + (long)p_Var13) == 0) {
      iVar5 = 0;
      iVar14 = 0;
      if (*(int *)(&this->field_0xf8 + (long)p_Var13) == 0) {
        iVar5 = (bottom_blob->w - local_e8.w) + *(int *)(&this->field_0xe4 + (long)p_Var13) +
                *(int *)(&this->field_0xe8 + (long)p_Var13);
        iVar14 = (bottom_blob->h - local_e8.h) + *(int *)(&this->field_0xec + (long)p_Var13) +
                 *(int *)(&this->field_0xf0 + (long)p_Var13);
      }
      iVar14 = iVar14 + (int)local_90;
      local_78 = (long)((int)local_f0 << 2);
      local_90 = (long)iVar12;
      if ((int)uVar2 < 1) {
        uVar16 = 0;
      }
      uVar11 = 0;
      while (uVar15 = uVar11, uVar15 != uVar16) {
        local_58 = (long)local_e8.w;
        local_60 = local_e8.data;
        local_68 = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
        local_108 = (void *)(top_blob->cstep * uVar15 * top_blob->elemsize + (long)top_blob->data);
        local_f0 = this->_vptr_Pooling_x86;
        local_70 = local_e8.cstep * uVar15;
        iVar12 = 0;
        while (iVar18 = iVar12, iVar18 <= (int)local_98) {
          lVar9 = (long)(*(int *)(&this->field_0xe0 + (long)local_f0[-3]) * iVar18);
          local_50 = (void *)((local_58 * lVar9 + local_70) * local_68 + (long)local_e8.data);
          for (lVar23 = 0; lVar23 <= local_90; lVar23 = lVar23 + 1) {
            p_Var13 = local_f0[-3];
            uVar25 = 0;
            uVar11 = (ulong)*(uint *)(&this->field_0xd8 + (long)p_Var13);
            if ((int)*(uint *)(&this->field_0xd8 + (long)p_Var13) < 1) {
              uVar11 = uVar25;
            }
            lVar21 = (long)(*(int *)(&this->field_0xdc + (long)p_Var13) * (int)lVar23);
            pvVar19 = (void *)(lVar21 * 0x10 + (long)local_50);
            auVar28 = ZEXT816(0);
            iVar12 = 0;
            for (; uVar25 != uVar11; uVar25 = uVar25 + 1) {
              lVar17 = uVar25 + lVar9;
              if (*(int *)(&this->field_0xec + (long)p_Var13) <= lVar17) {
                if (iVar14 - *(int *)(&this->field_0xf0 + (long)p_Var13) <= lVar17) break;
                uVar2 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
                if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var13) < 1) {
                  uVar2 = 0;
                }
                lVar17 = lVar21;
                for (lVar6 = 0; (ulong)uVar2 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
                  auVar33 = auVar28;
                  if (*(int *)(&this->field_0xe4 + (long)p_Var13) <= lVar17) {
                    if ((iVar5 + iVar7) - *(int *)(&this->field_0xe8 + (long)p_Var13) <= lVar17)
                    break;
                    auVar39 = *(undefined1 (*) [16])((long)pvVar19 + lVar6);
                    auVar33._0_4_ = auVar28._0_4_ + auVar39._0_4_;
                    auVar33._4_4_ = auVar28._4_4_ + auVar39._4_4_;
                    auVar33._8_4_ = auVar28._8_4_ + auVar39._8_4_;
                    auVar33._12_4_ = auVar28._12_4_ + auVar39._12_4_;
                    iVar12 = iVar12 + 1;
                  }
                  lVar17 = lVar17 + 1;
                  auVar28 = auVar33;
                }
              }
              pvVar19 = (void *)((long)pvVar19 + local_68 * local_58);
            }
            fVar27 = 1.0 / (float)iVar12;
            auVar39._0_4_ = fVar27 * auVar28._0_4_;
            auVar39._4_4_ = fVar27 * auVar28._4_4_;
            auVar39._8_4_ = fVar27 * auVar28._8_4_;
            auVar39._12_4_ = fVar27 * auVar28._12_4_;
            *(undefined1 (*) [16])((long)local_108 + lVar23 * 0x10) = auVar39;
          }
          local_108 = (void *)((long)local_108 + local_78 * 4);
          local_84 = iVar18;
          iVar12 = iVar18 + 1;
        }
        local_80 = uVar15;
        uVar11 = uVar15 + 1;
      }
    }
    else {
      fVar27 = 1.0 / (float)iVar5;
      uVar15 = 0;
      uVar11 = uVar11 & 0xffffffff;
      if (iVar5 < 1) {
        uVar11 = 0;
      }
      if ((int)uVar2 < 1) {
        uVar16 = 0;
      }
      for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        pvVar19 = (void *)(top_blob->cstep * uVar15 * top_blob->elemsize + (long)top_blob->data);
        for (iVar5 = 0; iVar5 <= (int)local_98; iVar5 = iVar5 + 1) {
          pp_Var3 = this->_vptr_Pooling_x86;
          for (lVar9 = 0; lVar9 <= iVar12; lVar9 = lVar9 + 1) {
            fVar29 = 0.0;
            fVar30 = 0.0;
            fVar31 = 0.0;
            fVar32 = 0.0;
            for (uVar25 = 0; uVar11 != uVar25; uVar25 = uVar25 + 1) {
              auVar28 = *(undefined1 (*) [16])
                         ((long)local_e8.data +
                         (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar25] * 0x10 +
                         (long)(*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) * (int)lVar9 * 4) *
                         4 + (long)*(int *)(&this->field_0xe0 + (long)pp_Var3[-3]) * (long)iVar5 *
                             (long)local_e8.w *
                             CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                             local_e8.cstep * uVar15 *
                             CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
              fVar29 = fVar29 + auVar28._0_4_;
              fVar30 = fVar30 + auVar28._4_4_;
              fVar31 = fVar31 + auVar28._8_4_;
              fVar32 = fVar32 + auVar28._12_4_;
            }
            auVar28._0_4_ = fVar29 * fVar27;
            auVar28._4_4_ = fVar30 * fVar27;
            auVar28._8_4_ = fVar31 * fVar27;
            auVar28._12_4_ = fVar32 * fVar27;
            *(undefined1 (*) [16])((long)pvVar19 + lVar9 * 0x10) = auVar28;
          }
          pvVar19 = (void *)((long)pvVar19 + (long)((int)local_f0 << 2) * 4);
        }
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  iVar5 = 0;
LAB_00315588:
  piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        free(local_e8.data);
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int Pooling_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

#if __AVX512F__
    if (elempack == 16)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _max = _mm512_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _max = _mm512_max_ps(_max, _val);
                        ptr += 16;
                    }

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _sum = _mm512_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _sum = _mm512_add_ps(_sum, _val);
                        ptr += 16;
                    }

                    __m512 _inv_size = _mm512_set1_ps(1.f / size);
                    __m512 _avg = _mm512_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                        __m512 _max = _mm512_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                            _max = _mm512_max_ps(_max, _val);
                        }

                        _mm512_storeu_ps(outptr, _max);
                        outptr += 16;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m512 _sum = _mm512_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m512 _val = _mm512_loadu_ps(m.row(sy) + sx * 16);
                                    _sum = _mm512_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m512 _inv_area = _mm512_set1_ps(1.f / area);
                            __m512 _avg = _mm512_mul_ps(_sum, _inv_area);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m512 _inv_maxk = _mm512_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            __m512 _sum = _mm512_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                _sum = _mm512_add_ps(_sum, _val);
                            }

                            __m512 _avg = _mm512_mul_ps(_sum, _inv_maxk);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX512F__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}